

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::Flush(TableBuilder *this)

{
  bool bVar1;
  BlockBuilder *in_RDI;
  long in_FS_OFFSET;
  Rep *r;
  BlockHandle *in_stack_00000018;
  BlockBuilder *in_stack_00000020;
  TableBuilder *in_stack_00000028;
  Options *rhs;
  BlockBuilder *this_00;
  TableBuilder *in_stack_fffffffffffffff0;
  FilterBlockBuilder *this_01;
  
  this_01 = *(FilterBlockBuilder **)(in_FS_OFFSET + 0x28);
  rhs = in_RDI->options_;
  if ((((char)rhs[4].compression ^ 0xff) & kSnappyCompression) == kNoCompression) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0x7f,"void leveldb::TableBuilder::Flush()");
  }
  this_00 = in_RDI;
  bVar1 = ok(in_stack_fffffffffffffff0);
  if ((bVar1) && (bVar1 = BlockBuilder::empty(in_RDI), !bVar1)) {
    if (((*(byte *)&rhs[5].comparator ^ 0xff) & 1) == 0) {
      __assert_fail("!r->pending_index_entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                    ,0x82,"void leveldb::TableBuilder::Flush()");
    }
    WriteBlock(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    bVar1 = ok(in_stack_fffffffffffffff0);
    if (bVar1) {
      *(undefined1 *)&rhs[5].comparator = 1;
      (*(rhs[2].comparator)->_vptr_Comparator[4])(&stack0xfffffffffffffff0);
      Status::operator=((Status *)this_00,(Status *)rhs);
      Status::~Status((Status *)in_RDI);
    }
    if (rhs[4].filter_policy != (FilterPolicy *)0x0) {
      FilterBlockBuilder::StartBlock(this_01,(uint64_t)in_stack_fffffffffffffff0);
    }
  }
  if (*(FilterBlockBuilder **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TableBuilder::Flush() {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->data_block.empty()) return;
  assert(!r->pending_index_entry);
  WriteBlock(&r->data_block, &r->pending_handle);
  if (ok()) {
    r->pending_index_entry = true;
    r->status = r->file->Flush();
  }
  if (r->filter_block != nullptr) {
    r->filter_block->StartBlock(r->offset);
  }
}